

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# level_aux_mesh.cxx
# Opt level: O2

void __thiscall level_aux_mesh::create_uvs(level_aux_mesh *this)

{
  pointer pbVar1;
  pointer pbVar2;
  
  std::vector<xray_re::_vector2<float>,_std::allocator<xray_re::_vector2<float>_>_>::resize
            (&(this->super_xr_mesh_builder).m_texcoords,3);
  ((this->super_xr_mesh_builder).m_texcoords.
   super__Vector_base<xray_re::_vector2<float>,_std::allocator<xray_re::_vector2<float>_>_>._M_impl.
   super__Vector_impl_data._M_start)->field_0 = (anon_union_8_3_f28016de_for__vector2<float>_1)0x0;
  (this->super_xr_mesh_builder).m_texcoords.
  super__Vector_base<xray_re::_vector2<float>,_std::allocator<xray_re::_vector2<float>_>_>._M_impl.
  super__Vector_impl_data._M_start[1].field_0 =
       (anon_union_8_3_f28016de_for__vector2<float>_1)0x3f80000000000000;
  (this->super_xr_mesh_builder).m_texcoords.
  super__Vector_base<xray_re::_vector2<float>,_std::allocator<xray_re::_vector2<float>_>_>._M_impl.
  super__Vector_impl_data._M_start[2].field_0 =
       (anon_union_8_3_f28016de_for__vector2<float>_1)0x3f800000;
  pbVar1 = (this->super_xr_mesh_builder).m_faces.
           super__Vector_base<xray_re::xr_mesh_builder::b_face,_std::allocator<xray_re::xr_mesh_builder::b_face>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (pbVar2 = (this->super_xr_mesh_builder).m_faces.
                super__Vector_base<xray_re::xr_mesh_builder::b_face,_std::allocator<xray_re::xr_mesh_builder::b_face>_>
                ._M_impl.super__Vector_impl_data._M_start; pbVar2 != pbVar1; pbVar2 = pbVar2 + 1) {
    *(undefined8 *)((long)&pbVar2->field_0 + 0x18) = 0x100000000;
    (pbVar2->field_0).field_0.tc[2] = 2;
  }
  return;
}

Assistant:

void level_aux_mesh::create_uvs()
{
	m_texcoords.resize(3);
	m_texcoords[0].set(0.f, 0.f);
	m_texcoords[1].set(0.f, 1.f);
	m_texcoords[2].set(1.f, 0.f);
	for (b_face_vec_it it = m_faces.begin(), end = m_faces.end();
			it != end; ++it) {
		it->tc0 = 0;
		it->tc1 = 1;
		it->tc2 = 2;
	}
}